

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CESkyCoord.cpp
# Opt level: O2

bool __thiscall
test_CESkyCoord::test_coords
          (test_CESkyCoord *this,CESkyCoord *test,CESkyCoord *expected,string *func,int *line)

{
  bool bVar1;
  char cVar2;
  CESkyCoordType CVar3;
  CESkyCoordType CVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  CEAngle local_170;
  CEAngle local_160;
  CEAngle local_150;
  CEAngle local_140;
  CEDate local_130;
  CEDate local_f0;
  CEDate local_b0;
  CEDate local_70;
  
  bVar1 = operator==(test,expected);
  cVar2 = (**(code **)(*(long *)this + 0x68))(this,bVar1,1,func,line);
  if (cVar2 == '\0') {
    CVar3 = CESkyCoord::GetCoordSystem(test);
    CVar4 = CESkyCoord::GetCoordSystem(expected);
    printf("     CoordSys (1 v 2): %d v %d\n",(ulong)CVar3,(ulong)CVar4);
    dVar5 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_130,dVar5,JD);
    (*test->_vptr_CESkyCoord[3])(&local_140,test,&local_130);
    dVar5 = CEAngle::Deg(&local_140);
    dVar6 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_70,dVar6,JD);
    (*expected->_vptr_CESkyCoord[3])(&local_150,expected,&local_70);
    dVar6 = CEAngle::Deg(&local_150);
    dVar7 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_b0,dVar7,JD);
    (*test->_vptr_CESkyCoord[3])(&local_160,test,&local_b0);
    dVar7 = CEAngle::Deg(&local_160);
    dVar8 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_f0,dVar8,JD);
    (*expected->_vptr_CESkyCoord[3])(&local_170,expected,&local_f0);
    dVar8 = CEAngle::Deg(&local_170);
    printf("     XCoords: %3.15e : %3.15e (deg), diff = %e arcsec\n",dVar5,dVar6,
           (dVar7 - dVar8) * 3600.0);
    CEAngle::~CEAngle(&local_170);
    CEDate::~CEDate(&local_f0);
    CEAngle::~CEAngle(&local_160);
    CEDate::~CEDate(&local_b0);
    CEAngle::~CEAngle(&local_150);
    CEDate::~CEDate(&local_70);
    CEAngle::~CEAngle(&local_140);
    CEDate::~CEDate(&local_130);
    dVar5 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_130,dVar5,JD);
    (*test->_vptr_CESkyCoord[4])(&local_140,test,&local_130);
    dVar5 = CEAngle::Deg(&local_140);
    dVar6 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_70,dVar6,JD);
    (*expected->_vptr_CESkyCoord[4])(&local_150,expected,&local_70);
    dVar6 = CEAngle::Deg(&local_150);
    dVar7 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_b0,dVar7,JD);
    (*test->_vptr_CESkyCoord[4])(&local_160,test,&local_b0);
    dVar7 = CEAngle::Deg(&local_160);
    dVar8 = CppEphem::julian_date_J2000();
    CEDate::CEDate(&local_f0,dVar8,JD);
    (*expected->_vptr_CESkyCoord[4])(&local_170,expected,&local_f0);
    dVar8 = CEAngle::Deg(&local_170);
    printf("     YCoords: %3.15e : %3.15e (deg), diff = %e arcsec\n",dVar5,dVar6,
           (dVar7 - dVar8) * 3600.0);
    CEAngle::~CEAngle(&local_170);
    CEDate::~CEDate(&local_f0);
    CEAngle::~CEAngle(&local_160);
    CEDate::~CEDate(&local_b0);
    CEAngle::~CEAngle(&local_150);
    CEDate::~CEDate(&local_70);
    CEAngle::~CEAngle(&local_140);
    CEDate::~CEDate(&local_130);
    (*test->_vptr_CESkyCoord[2])(&local_130,test,expected);
    dVar5 = CEAngle::Deg((CEAngle *)&local_130);
    printf("     AngSep: %e arcsec\n",dVar5 * 3600.0);
    CEAngle::~CEAngle((CEAngle *)&local_130);
  }
  return (bool)cVar2;
}

Assistant:

bool test_CESkyCoord::test_coords(const CESkyCoord&  test,
                                  const CESkyCoord&  expected,
                                  const std::string& func,
                                  const int&         line)
{
    // Test if the coordinates are equal
    bool pass = test_bool((test == expected), true, func, line);
    if (!pass) {
        std::printf("     CoordSys (1 v 2): %d v %d\n",
                    int(test.GetCoordSystem()), int(expected.GetCoordSystem()));
        std::printf("     XCoords: %3.15e : %3.15e (deg), diff = %e arcsec\n", 
                    test.XCoord().Deg(), expected.XCoord().Deg(), 
                    (test.XCoord().Deg()-expected.XCoord().Deg())*3600.0);
        std::printf("     YCoords: %3.15e : %3.15e (deg), diff = %e arcsec\n", 
                    test.YCoord().Deg(), expected.YCoord().Deg(), 
                    (test.YCoord().Deg()-expected.YCoord().Deg())*3600.0);
        std::printf("     AngSep: %e arcsec\n", 
                    test.AngularSeparation(expected).Deg()*3600.0);
    }
    return pass;
}